

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

void DoReadyWeaponToFire(AActor *self,bool prim,bool alt)

{
  AWeapon *this;
  AActor *ent;
  bool bVar1;
  ushort uVar2;
  int iVar3;
  DPSprite *this_00;
  FState *pFVar4;
  FState *pFVar5;
  FSoundID local_30;
  FName local_2c;
  AWeapon *local_28;
  AWeapon *weapon;
  player_t *player;
  bool alt_local;
  AActor *pAStack_10;
  bool prim_local;
  AActor *self_local;
  
  if (((self != (AActor *)0x0) && (weapon = (AWeapon *)self->player, weapon != (AWeapon *)0x0)) &&
     (local_28 = *(AWeapon **)&(weapon->super_AInventory).super_AActor.sprite,
     local_28 != (AWeapon *)0x0)) {
    player._6_1_ = alt;
    player._7_1_ = prim;
    pAStack_10 = self;
    bVar1 = AActor::InStateSequence(self,self->state,self->MissileState);
    if ((bVar1) ||
       (bVar1 = AActor::InStateSequence(pAStack_10,pAStack_10->state,pAStack_10->MeleeState), bVar1)
       ) {
      (*(pAStack_10->super_DThinker).super_DObject._vptr_DObject[0x25])();
    }
    iVar3 = FSoundID::operator_cast_to_int(&(local_28->ReadySound).super_FSoundID);
    bVar1 = false;
    if (iVar3 != 0) {
      this_00 = player_t::GetPSprite((player_t *)weapon,PSP_WEAPON);
      pFVar4 = DPSprite::GetState(this_00);
      this = local_28;
      FName::FName(&local_2c,NAME_Ready);
      pFVar5 = AActor::FindState((AActor *)this,&local_2c);
      bVar1 = pFVar4 == pFVar5;
    }
    if ((bVar1) &&
       (((*(uint *)&(local_28->super_AInventory).field_0x4dc & 2) == 0 ||
        (iVar3 = FRandom::operator()(&pr_wpnreadysnd), iVar3 < 0x80)))) {
      ent = pAStack_10;
      FSoundID::FSoundID(&local_30,&(local_28->ReadySound).super_FSoundID);
      S_Sound(ent,1,&local_30,1.0,1.0);
    }
    uVar2 = 0;
    if ((player._6_1_ & 1) != 0) {
      uVar2 = 4;
    }
    *(ushort *)((long)&(weapon->super_AInventory).super_AActor.FloatSpeed + 6) =
         *(ushort *)((long)&(weapon->super_AInventory).super_AActor.FloatSpeed + 6) |
         (player._7_1_ & 1) != 0 | uVar2;
  }
  return;
}

Assistant:

void DoReadyWeaponToFire (AActor *self, bool prim, bool alt)
{
	player_t *player;
	AWeapon *weapon;

	if (!self || !(player = self->player) || !(weapon = player->ReadyWeapon))
	{
		return;
	}

	// Change player from attack state
	if (self->InStateSequence(self->state, self->MissileState) ||
		self->InStateSequence(self->state, self->MeleeState))
	{
		static_cast<APlayerPawn *>(self)->PlayIdle ();
	}

	// Play ready sound, if any.
	if (weapon->ReadySound && player->GetPSprite(PSP_WEAPON)->GetState() == weapon->FindState(NAME_Ready))
	{
		if (!(weapon->WeaponFlags & WIF_READYSNDHALF) || pr_wpnreadysnd() < 128)
		{
			S_Sound (self, CHAN_WEAPON, weapon->ReadySound, 1, ATTN_NORM);
		}
	}

	// Prepare for firing action.
	player->WeaponState |= ((prim ? WF_WEAPONREADY : 0) | (alt ? WF_WEAPONREADYALT : 0));
	return;
}